

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

bool __thiscall cmCTestBZR::UpdateImpl(cmCTestBZR *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  string *arg;
  pointer pbVar4;
  vector<const_char_*,_std::allocator<const_char_*>_> bzr_update;
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  OutputLogger out;
  UpdateParser err;
  char **local_1d8;
  undefined8 uStack_1d0;
  long local_1c8;
  string local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_180 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_140 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [14];
  char *local_38;
  
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  pcVar1 = local_140 + 0x10;
  local_140._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_1b8,pcVar2,(string *)local_140);
  if ((pointer)local_140._0_8_ != pcVar1) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  if (local_1b8._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"BZRUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_140,pcVar2,(string *)local_180);
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_140);
    if ((pointer)local_140._0_8_ != pcVar1) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
  }
  cmSystemTools::ParseArguments(&local_198,&local_1b8);
  local_1d8 = (char **)0x0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  local_140._0_8_ = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)local_140);
  local_140._0_8_ = "pull";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)local_140);
  if (local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = local_198.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_140._0_8_ = (pbVar4->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)local_140);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_198.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_140._0_8_ = (this->URL)._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)local_140);
  local_140._0_8_ = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)local_140);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_180,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "pull-out> ");
  UpdateParser::UpdateParser((UpdateParser *)local_140,this,"pull-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,local_1d8,(OutputParser *)local_180,(OutputParser *)local_140
                     ,Auto);
  local_140._0_8_ = &PTR__UpdateParser_0095e8a0;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  local_140._0_8_ = &PTR__LineParser_009618b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._24_8_ != local_118) {
    operator_delete((void *)local_140._24_8_,local_118[0]._M_allocated_capacity + 1);
  }
  local_180._0_8_ = &PTR__LineParser_009618b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._24_8_ != &local_158) {
    operator_delete((void *)local_180._24_8_,local_158._M_allocated_capacity + 1);
  }
  if (local_1d8 != (char **)0x0) {
    operator_delete(local_1d8,local_1c8 - (long)local_1d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestBZR::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("BZRUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);

  // TODO: if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)

  // Use "bzr pull" to update the working tree.
  std::vector<char const*> bzr_update;
  bzr_update.push_back(this->CommandLineTool.c_str());
  bzr_update.push_back("pull");

  for (std::string const& arg : args) {
    bzr_update.push_back(arg.c_str());
  }

  bzr_update.push_back(this->URL.c_str());

  bzr_update.push_back(nullptr);

  // For some reason bzr uses stderr to display the update status.
  OutputLogger out(this->Log, "pull-out> ");
  UpdateParser err(this, "pull-err> ");
  return this->RunUpdateCommand(bzr_update.data(), &out, &err);
}